

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf,
              size_t size)

{
  pointer *ppTVar1;
  byte bVar2;
  uint uVar3;
  float fVar4;
  pointer pTVar5;
  iterator __position;
  pointer pTVar6;
  char cVar7;
  uint uVar8;
  undefined8 uVar9;
  size_type sVar10;
  string *psVar11;
  bool bVar12;
  int iVar13;
  undefined8 uVar14;
  char *pcVar15;
  size_t sVar16;
  long lVar17;
  bool bVar18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attr_name;
  string attr_type;
  size_t marker_size;
  EXRAttribute attrib;
  int local_32c;
  undefined1 local_328 [16];
  pointer local_318;
  size_t local_310;
  EXRVersion *local_308;
  string local_300;
  string *local_2e0;
  string *local_2d8;
  string *local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  string local_278;
  vector<TEXRAttribute,std::allocator<TEXRAttribute>> *local_258;
  size_t local_250;
  size_t local_248;
  TEXRAttribute local_240;
  
  if (empty_header != (bool *)0x0) {
    *empty_header = false;
  }
  if (((size == 0) || (version->multipart == 0)) || (*buf != '\0')) {
    (info->name)._M_string_length = 0;
    *(info->name)._M_dataplus._M_p = '\0';
    (info->type)._M_string_length = 0;
    *(info->type)._M_dataplus._M_p = '\0';
    (info->display_window).max_x = 0;
    (info->display_window).max_y = 0;
    info->screen_window_center[0] = 0.0;
    info->screen_window_center[1] = 0.0;
    info->line_order = 0;
    (info->display_window).min_x = 0;
    (info->display_window).min_y = 0;
    (info->display_window).max_x = 0;
    (info->data_window).min_x = 0;
    (info->data_window).min_y = 0;
    (info->data_window).max_x = 0;
    (info->data_window).max_y = 0;
    info->screen_window_width = -1.0;
    info->pixel_aspect_ratio = -1.0;
    info->tiled = 0;
    info->tile_size_x = -1;
    info->tile_size_y = -1;
    info->tile_level_mode = -1;
    info->tile_rounding_mode = -1;
    pTVar5 = (info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl
        .super__Vector_impl_data._M_finish != pTVar5) {
      (info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar5;
    }
    local_2d0 = &info->name;
    local_2d8 = &info->type;
    local_258 = (vector<TEXRAttribute,std::allocator<TEXRAttribute>> *)&info->attributes;
    lVar17 = 0x3ff;
    local_2c8 = 0;
    local_2c0 = 0;
    local_2b8 = 0;
    local_2b0 = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_298 = 0;
    local_290 = 0;
    local_280 = 0;
    local_288 = 0;
    local_310 = size;
    local_308 = version;
    local_2e0 = err;
    local_250 = size;
    do {
      psVar11 = local_2e0;
      if (local_310 == 0) {
        local_32c = -4;
        if (local_2e0 != (string *)0x0) {
          std::__cxx11::string::append((char *)local_2e0);
        }
        bVar12 = false;
        local_310 = 0;
        break;
      }
      if (*buf == '\0') {
        local_310 = local_310 - 1;
        bVar12 = true;
        break;
      }
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      local_300._M_string_length = 0;
      local_300.field_2._M_local_buf[0] = '\0';
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      local_278._M_string_length = 0;
      local_278.field_2._M_local_buf[0] = '\0';
      local_318 = (pointer)0x0;
      local_328 = (undefined1  [16])0x0;
      bVar12 = ReadAttribute(&local_300,&local_278,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328,
                             &local_248,(char *)buf,local_310);
      if (bVar12) {
        buf = buf + local_248;
        local_310 = local_310 - local_248;
        if ((((local_308->tiled == 0) && (local_308->multipart == 0)) && (local_308->non_image == 0)
            ) || (iVar13 = std::__cxx11::string::compare((char *)&local_300), iVar13 != 0)) {
          iVar13 = std::__cxx11::string::compare((char *)&local_300);
          if (iVar13 == 0) {
            bVar2 = *(byte *)local_328._0_8_;
            if (bVar2 < 5) {
              info->compression_type = (uint)bVar2;
              local_280 = 1;
LAB_001c90f5:
              bVar12 = true;
            }
            else {
              if (bVar2 == 0x80) {
                pcVar15 = "ZFP compression is not supported.";
              }
              else {
                pcVar15 = "Unknown compression type.";
              }
              if (psVar11 == (string *)0x0) {
                local_32c = -8;
                goto LAB_001c9051;
              }
              bVar12 = false;
              std::__cxx11::string::_M_replace
                        ((ulong)psVar11,0,(char *)psVar11->_M_string_length,(ulong)pcVar15);
              local_32c = -8;
            }
            goto LAB_001c90f8;
          }
          iVar13 = std::__cxx11::string::compare((char *)&local_300);
          if (iVar13 == 0) {
            bVar12 = ReadChannelInfo(&info->channels,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_328);
            if ((!bVar12) ||
               (pTVar6 = (info->channels).
                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
               pTVar6 == (info->channels).
                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
              if (psVar11 != (string *)0x0) {
                std::__cxx11::string::append((char *)psVar11);
              }
              local_32c = -4;
              goto LAB_001c91e1;
            }
            local_288 = CONCAT71((int7)((ulong)pTVar6 >> 8),1);
          }
          else {
            iVar13 = std::__cxx11::string::compare((char *)&local_300);
            if (iVar13 == 0) {
              if (0xf < (ulong)(local_328._8_8_ - local_328._0_8_)) {
                (info->data_window).min_x = *(int *)local_328._0_8_;
                (info->data_window).min_y = *(int *)(local_328._0_8_ + 4);
                (info->data_window).max_x = *(int *)(local_328._0_8_ + 8);
                iVar13 = *(int *)(local_328._0_8_ + 0xc);
                (info->data_window).max_y = iVar13;
                local_290 = CONCAT71((uint7)(uint3)((uint)iVar13 >> 8),1);
              }
            }
            else {
              iVar13 = std::__cxx11::string::compare((char *)&local_300);
              if (iVar13 == 0) {
                if (0xf < (ulong)(local_328._8_8_ - local_328._0_8_)) {
                  (info->display_window).min_x = *(int *)local_328._0_8_;
                  (info->display_window).min_y = *(int *)(local_328._0_8_ + 4);
                  (info->display_window).max_x = *(int *)(local_328._0_8_ + 8);
                  iVar13 = *(int *)(local_328._0_8_ + 0xc);
                  (info->display_window).max_y = iVar13;
                  local_298 = CONCAT71((uint7)(uint3)((uint)iVar13 >> 8),1);
                }
              }
              else {
                iVar13 = std::__cxx11::string::compare((char *)&local_300);
                if (iVar13 == 0) {
                  if (local_328._8_8_ != local_328._0_8_) {
                    info->line_order = (uint)*(byte *)local_328._0_8_;
                    local_2a0 = 1;
                  }
                }
                else {
                  iVar13 = std::__cxx11::string::compare((char *)&local_300);
                  if (iVar13 == 0) {
                    if (3 < (ulong)(local_328._8_8_ - local_328._0_8_)) {
                      fVar4 = *(float *)local_328._0_8_;
                      info->pixel_aspect_ratio = fVar4;
                      local_2a8 = CONCAT71((uint7)(uint3)((uint)fVar4 >> 8),1);
                    }
                  }
                  else {
                    iVar13 = std::__cxx11::string::compare((char *)&local_300);
                    if (iVar13 == 0) {
                      if (7 < (ulong)(local_328._8_8_ - local_328._0_8_)) {
                        info->screen_window_center[0] = *(float *)local_328._0_8_;
                        fVar4 = *(float *)(local_328._0_8_ + 4);
                        info->screen_window_center[1] = fVar4;
                        local_2b0 = CONCAT71((uint7)(uint3)((uint)fVar4 >> 8),1);
                      }
                    }
                    else {
                      iVar13 = std::__cxx11::string::compare((char *)&local_300);
                      if (iVar13 == 0) {
                        if (3 < (ulong)(local_328._8_8_ - local_328._0_8_)) {
                          fVar4 = *(float *)local_328._0_8_;
                          info->screen_window_width = fVar4;
                          local_2b8 = CONCAT71((uint7)(uint3)((uint)fVar4 >> 8),1);
                        }
                      }
                      else {
                        iVar13 = std::__cxx11::string::compare((char *)&local_300);
                        if (iVar13 == 0) {
                          if (3 < (ulong)(local_328._8_8_ - local_328._0_8_)) {
                            info->chunk_count = *(int *)local_328._0_8_;
                          }
                        }
                        else {
                          iVar13 = std::__cxx11::string::compare((char *)&local_300);
                          if (iVar13 == 0) {
                            if ((local_328._0_8_ != local_328._8_8_) &&
                               (*(uchar *)local_328._0_8_ != '\0')) {
                              local_240.name[0] = '\0';
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_328,(value_type_conflict3 *)&local_240);
                              sVar16 = strlen((char *)local_328._0_8_);
                              uVar14 = std::__cxx11::string::resize((ulong)local_2d0,(char)sVar16);
                              local_2c0 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
                              std::__cxx11::string::_M_replace
                                        ((ulong)local_2d0,0,(char *)(info->name)._M_string_length,
                                         local_328._0_8_);
                            }
                          }
                          else {
                            iVar13 = std::__cxx11::string::compare((char *)&local_300);
                            if (iVar13 == 0) {
                              if ((local_328._0_8_ != local_328._8_8_) &&
                                 (*(uchar *)local_328._0_8_ != '\0')) {
                                local_240.name[0] = '\0';
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                push_back((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          local_328,(value_type_conflict3 *)&local_240);
                                sVar16 = strlen((char *)local_328._0_8_);
                                uVar14 = std::__cxx11::string::resize((ulong)local_2d8,(char)sVar16)
                                ;
                                local_2c8 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
                                std::__cxx11::string::_M_replace
                                          ((ulong)local_2d8,0,(char *)(info->type)._M_string_length,
                                           local_328._0_8_);
                              }
                            }
                            else if ((ulong)(((long)(info->attributes).
                                                                                                        
                                                  super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(info->attributes).
                                                                                                        
                                                  super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                            0xf83e0f83e0f83e1) < 0x80) {
                              strncpy(local_240.name,local_300._M_dataplus._M_p,0xff);
                              strncpy(local_240.type,local_278._M_dataplus._M_p,0xff);
                              local_240.name[0xff] = '\0';
                              local_240.type[0xff] = '\0';
                              uVar14 = local_328._0_8_;
                              uVar9 = local_328._8_8_;
                              local_240.size = (int)(local_328._8_8_ - local_328._0_8_);
                              local_240.value = (uchar *)malloc(local_328._8_8_ - local_328._0_8_);
                              sVar16 = uVar9 - uVar14;
                              if (sVar16 == 0) {
                                uVar14 = std::__throw_out_of_range_fmt
                                                   (
                                                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                                  ,0,0);
                                if ((pointer)local_328._0_8_ != (pointer)0x0) {
                                  operator_delete((void *)local_328._0_8_);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_278._M_dataplus._M_p != &local_278.field_2) {
                                  operator_delete(local_278._M_dataplus._M_p);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_300._M_dataplus._M_p != &local_300.field_2) {
                                  operator_delete(local_300._M_dataplus._M_p);
                                }
                                _Unwind_Resume(uVar14);
                              }
                              memcpy(local_240.value,(void *)uVar14,sVar16);
                              __position._M_current =
                                   (info->attributes).
                                   super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                              if (__position._M_current ==
                                  (info->attributes).
                                  super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<TEXRAttribute,std::allocator<TEXRAttribute>>::
                                _M_realloc_insert<TEXRAttribute_const&>
                                          (local_258,__position,&local_240);
                              }
                              else {
                                memcpy(__position._M_current,&local_240,0x210);
                                ppTVar1 = &(info->attributes).
                                           super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                                *ppTVar1 = *ppTVar1 + 1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          if (local_328._8_8_ - local_328._0_8_ == 9) {
            uVar3 = *(uint *)(local_328._0_8_ + 4);
            if (-1 < (int)(*(uint *)local_328._0_8_ | uVar3)) {
              uVar8 = *(uint *)(local_328._0_8_ + 8);
              info->tile_size_x = *(uint *)local_328._0_8_;
              info->tile_size_y = uVar3;
              info->tile_level_mode = (byte)uVar8 & 3;
              info->tile_rounding_mode = (byte)((byte)uVar8 >> 4) & 1;
              info->tiled = 1;
              goto LAB_001c90f5;
            }
            local_32c = -8;
            if (psVar11 != (string *)0x0) {
              bVar12 = false;
              std::__cxx11::string::_M_replace
                        ((ulong)psVar11,0,(char *)psVar11->_M_string_length,0x25a923);
              goto LAB_001c90f8;
            }
          }
          else {
            local_32c = -4;
            if (psVar11 != (string *)0x0) {
              std::__cxx11::string::append((char *)psVar11);
            }
          }
LAB_001c9051:
          bVar12 = false;
LAB_001c90f8:
          if (!bVar12) goto LAB_001c91e1;
        }
        bVar12 = true;
      }
      else {
        local_32c = -4;
        if (psVar11 != (string *)0x0) {
          std::__cxx11::string::append((char *)psVar11);
        }
LAB_001c91e1:
        bVar12 = false;
      }
      if ((pointer)local_328._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_328._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
      bVar18 = lVar17 != 0;
      lVar17 = lVar17 + -1;
    } while ((bool)(bVar12 & bVar18));
    if (bVar12) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_240);
      if ((local_280 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),
                   "\"compression\" attribute not found in the header.",0x30);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_288 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),
                   "\"channels\" attribute not found in the header.",0x2d);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_2a0 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),
                   "\"lineOrder\" attribute not found in the header.",0x2e);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_298 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),
                   "\"displayWindow\" attribute not found in the header.",0x32);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_290 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),
                   "\"dataWindow\" attribute not found in the header or invalid.",0x3a);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_2a8 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),
                   "\"pixelAspectRatio\" attribute not found in the header.",0x35);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_2b8 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),
                   "\"screenWindowWidth\" attribute not found in the header.",0x36);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_2b0 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),
                   "\"screenWindowCenter\" attribute not found in the header.",0x37);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_308->multipart != 0) || (local_308->non_image != 0)) {
        if ((local_2c0 & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_240.name + 0x10),
                     "\"name\" attribute not found in the header.",0x29);
          cVar7 = (char)(ostream *)(local_240.name + 0x10);
          std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
        }
        if ((local_2c8 & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_240.name + 0x10),
                     "\"type\" attribute not found in the header.",0x29);
          cVar7 = (char)(ostream *)(local_240.name + 0x10);
          std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
        }
      }
      std::__cxx11::stringbuf::str();
      psVar11 = local_2e0;
      sVar10 = local_300._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
      if ((sVar10 != 0) && (local_32c = -9, psVar11 != (string *)0x0)) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)psVar11,(ulong)local_300._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p);
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_240);
      std::ios_base::~ios_base((ios_base *)(local_240.name + 0x80));
      if (sVar10 == 0) {
        info->header_len = (int)local_250 - (int)local_310;
        local_32c = 0;
      }
    }
  }
  else {
    local_32c = 0;
    if (empty_header != (bool *)0x0) {
      *empty_header = true;
    }
  }
  return local_32c;
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf, size_t size) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (size > 0 && marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  // According to the spec, the header of every OpenEXR file must contain at
  // least the following attributes:
  //
  // channels chlist
  // compression compression
  // dataWindow box2i
  // displayWindow box2i
  // lineOrder lineOrder
  // pixelAspectRatio float
  // screenWindowCenter v2f
  // screenWindowWidth float
  bool has_channels = false;
  bool has_compression = false;
  bool has_data_window = false;
  bool has_display_window = false;
  bool has_line_order = false;
  bool has_pixel_aspect_ratio = false;
  bool has_screen_window_center = false;
  bool has_screen_window_width = false;
  bool has_name = false;
  bool has_type = false;

  info->name.clear();
  info->type.clear();

  info->data_window.min_x = 0;
  info->data_window.min_y = 0;
  info->data_window.max_x = 0;
  info->data_window.max_y = 0;
  info->line_order = 0;  // @fixme
  info->display_window.min_x = 0;
  info->display_window.min_y = 0;
  info->display_window.max_x = 0;
  info->display_window.max_y = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tiled = 0;
  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  size_t orig_size = size;
  for (size_t nattr = 0; nattr < TINYEXR_MAX_HEADER_ATTRIBUTES; nattr++) {
    if (0 == size) {
      if (err) {
        (*err) += "Insufficient data size for attributes.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    } else if (marker[0] == '\0') {
      size--;
      break;
    }

    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    size_t marker_size;
    if (!tinyexr::ReadAttribute(&attr_name, &attr_type, &data, &marker_size,
                                marker, size)) {
      if (err) {
        (*err) += "Failed to read attribute.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    marker += marker_size;
    size -= marker_size;

    // For a multipart file, the version field 9th bit is 0.
    if ((version->tiled || version->multipart || version->non_image) && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      if (data.size() != 9) {
        if (err) {
          (*err) += "(ParseEXRHeader) Invalid attribute data size. Attribute data size must be 9.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      assert(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      if (x_size > static_cast<unsigned int>(std::numeric_limits<int>::max()) ||
          y_size > static_cast<unsigned int>(std::numeric_limits<int>::max())) {
        if (err) {
          (*err) = "Tile sizes were invalid.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;
      info->tiled = 1;
    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);
      has_compression = true;

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      if (!ReadChannelInfo(info->channels, data)) {
        if (err) {
          (*err) += "Failed to parse channel info.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      if (info->channels.size() < 1) {
        if (err) {
          (*err) += "# of channels is zero.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      has_channels = true;

    } else if (attr_name.compare("dataWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->data_window.min_x, &data.at(0), sizeof(int));
        memcpy(&info->data_window.min_y, &data.at(4), sizeof(int));
        memcpy(&info->data_window.max_x, &data.at(8), sizeof(int));
        memcpy(&info->data_window.max_y, &data.at(12), sizeof(int));
        tinyexr::swap4(&info->data_window.min_x);
        tinyexr::swap4(&info->data_window.min_y);
        tinyexr::swap4(&info->data_window.max_x);
        tinyexr::swap4(&info->data_window.max_y);
        has_data_window = true;
      }
    } else if (attr_name.compare("displayWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->display_window.min_x, &data.at(0), sizeof(int));
        memcpy(&info->display_window.min_y, &data.at(4), sizeof(int));
        memcpy(&info->display_window.max_x, &data.at(8), sizeof(int));
        memcpy(&info->display_window.max_y, &data.at(12), sizeof(int));
        tinyexr::swap4(&info->display_window.min_x);
        tinyexr::swap4(&info->display_window.min_y);
        tinyexr::swap4(&info->display_window.max_x);
        tinyexr::swap4(&info->display_window.max_y);

        has_display_window = true;
      }
    } else if (attr_name.compare("lineOrder") == 0) {
      if (data.size() >= 1) {
        info->line_order = static_cast<int>(data[0]);
        has_line_order = true;
      }
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
        tinyexr::swap4(&info->pixel_aspect_ratio);
        has_pixel_aspect_ratio = true;
      }
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      if (data.size() >= 8) {
        memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
        memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
        tinyexr::swap4(&info->screen_window_center[0]);
        tinyexr::swap4(&info->screen_window_center[1]);
        has_screen_window_center = true;
      }
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
        tinyexr::swap4(&info->screen_window_width);

        has_screen_window_width = true;
      }
    } else if (attr_name.compare("chunkCount") == 0) {
      if (data.size() >= sizeof(int)) {
        memcpy(&info->chunk_count, &data.at(0), sizeof(int));
        tinyexr::swap4(&info->chunk_count);
      }
    } else if (attr_name.compare("name") == 0) {
      if (!data.empty() && data[0]) {
        data.push_back(0);
        size_t len = strlen(reinterpret_cast<const char*>(&data[0]));
        info->name.resize(len);
        info->name.assign(reinterpret_cast<const char*>(&data[0]), len);
        has_name = true;
      }
    } else if (attr_name.compare("type") == 0) {
      if (!data.empty() && data[0]) {
        data.push_back(0);
        size_t len = strlen(reinterpret_cast<const char*>(&data[0]));
        info->type.resize(len);
        info->type.assign(reinterpret_cast<const char*>(&data[0]), len);
        has_type = true;
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_CUSTOM_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
        EXRAttribute attrib;
#ifdef _MSC_VER
        strncpy_s(attrib.name, attr_name.c_str(), 255);
        strncpy_s(attrib.type, attr_type.c_str(), 255);
#else
        strncpy(attrib.name, attr_name.c_str(), 255);
        strncpy(attrib.type, attr_type.c_str(), 255);
#endif
        attrib.name[255] = '\0';
        attrib.type[255] = '\0';
        //std::cout << "i = " << info->attributes.size() << ", dsize = " << data.size() << "\n";
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }
  }

  // Check if required attributes exist
  {
    std::stringstream ss_err;

    if (!has_compression) {
      ss_err << "\"compression\" attribute not found in the header."
             << std::endl;
    }

    if (!has_channels) {
      ss_err << "\"channels\" attribute not found in the header." << std::endl;
    }

    if (!has_line_order) {
      ss_err << "\"lineOrder\" attribute not found in the header." << std::endl;
    }

    if (!has_display_window) {
      ss_err << "\"displayWindow\" attribute not found in the header."
             << std::endl;
    }

    if (!has_data_window) {
      ss_err << "\"dataWindow\" attribute not found in the header or invalid."
             << std::endl;
    }

    if (!has_pixel_aspect_ratio) {
      ss_err << "\"pixelAspectRatio\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_width) {
      ss_err << "\"screenWindowWidth\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_center) {
      ss_err << "\"screenWindowCenter\" attribute not found in the header."
             << std::endl;
    }

    if (version->multipart || version->non_image) {
      if (!has_name) {
        ss_err << "\"name\" attribute not found in the header."
          << std::endl;
      }
      if (!has_type) {
        ss_err << "\"type\" attribute not found in the header."
          << std::endl;
      }
    }

    if (!(ss_err.str().empty())) {
      if (err) {
        (*err) += ss_err.str();
      }

      return TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  info->header_len = static_cast<unsigned int>(orig_size - size);

  return TINYEXR_SUCCESS;
}